

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_valid_public_key(uint8_t *public_key,uECC_Curve curve)

{
  uECC_word_t *native;
  char cVar1;
  byte num_words;
  bool bVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uECC_word_t _public [8];
  uECC_word_t tmp1 [4];
  uECC_word_t product [8];
  uECC_word_t local_c8 [7];
  ulong uStack_90;
  uECC_word_t local_88 [3];
  ulong uStack_70;
  uECC_word_t local_68 [8];
  
  cVar1 = curve->num_bytes;
  uECC_vli_bytesToNative(local_c8,public_key,(int)cVar1);
  num_words = curve->num_words;
  native = local_c8 + (char)num_words;
  uECC_vli_bytesToNative(native,public_key + cVar1,(int)cVar1);
  if ((char)(num_words * '\x02') < '\x01') {
    return 0;
  }
  uVar8 = (uint)num_words;
  uVar6 = 0;
  uVar7 = 0;
  do {
    uVar7 = uVar7 | local_c8[uVar6];
    uVar6 = uVar6 + 1;
  } while ((byte)(num_words * '\x02') != uVar6);
  uVar5 = uVar8;
  if (uVar7 == 0) {
    return 0;
  }
  while( true ) {
    uVar5 = uVar5 - 1;
    if ((char)uVar5 < '\0') {
      return 0;
    }
    uVar7 = (ulong)((uVar5 & 0x7f) << 3);
    uVar6 = *(ulong *)((long)curve->p + uVar7);
    uVar7 = *(ulong *)((long)local_c8 + uVar7);
    if (uVar7 < uVar6) break;
    if (uVar6 < uVar7) {
      return 0;
    }
  }
  while( true ) {
    uVar8 = uVar8 - 1;
    if ((char)uVar8 < '\0') {
      return 0;
    }
    uVar7 = (ulong)((uVar8 & 0x7f) << 3);
    uVar6 = *(ulong *)((long)curve->p + uVar7);
    uVar7 = *(ulong *)((long)native + uVar7);
    if (uVar7 < uVar6) break;
    if (uVar6 < uVar7) {
      return 0;
    }
  }
  uECC_vli_mult(local_68,native,native,num_words);
  (*curve->mmod_fast)(local_88,local_68);
  (*curve->x_side)(local_68,local_c8,curve);
  if (-1 < (char)(num_words - 1)) {
    uVar6 = 0;
    lVar3 = (ulong)(byte)(num_words - 1) + 1;
    do {
      uVar6 = uVar6 | (&uStack_70)[lVar3] ^ (&uStack_90)[lVar3];
      lVar4 = lVar3 + -1;
      bVar2 = 0 < lVar3;
      lVar3 = lVar4;
    } while (lVar4 != 0 && bVar2);
    return (uint)(uVar6 == 0);
  }
  return 1;
}

Assistant:

int uECC_valid_public_key(const uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
    uECC_vli_bytesToNative(
        _public + curve->num_words, public_key + curve->num_bytes, curve->num_bytes);
#endif
    return uECC_valid_point(_public, curve);
}